

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nlsol_ex_sol.h
# Opt level: O0

void __thiscall
ExampleSOLHandler::OnIntSuffix<mp::SuffixReader<int>>(ExampleSOLHandler *this,SuffixReader<int> *sr)

{
  int iVar1;
  SuffixInfo *this_00;
  ExampleModel *pEVar2;
  mapped_type *this_01;
  pair<int,_int> pVar3;
  size_type sVar4;
  reference pvVar5;
  SuffixReader<int> *in_RSI;
  ExampleSOLHandler *in_RDI;
  pair<int,_int> val;
  mapped_type *suf_val;
  string *name;
  int kind;
  SuffixInfo *si;
  VecReader<std::pair<int,_int>_> *in_stack_ffffffffffffff68;
  vector<double,_std::allocator<double>_> *__new_size;
  undefined4 in_stack_ffffffffffffff90;
  int iStack_68;
  key_type *in_stack_ffffffffffffffa8;
  map<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::vector<double,_std::allocator<double>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::vector<double,_std::allocator<double>_>_>_>_>
  *in_stack_ffffffffffffffb0;
  
  this_00 = mp::SuffixReader<int>::SufInfo(in_RSI);
  mp::SuffixInfo::Kind(this_00);
  mp::SuffixInfo::Name_abi_cxx11_(this_00);
  pEVar2 = Model(in_RDI);
  std::make_pair<std::__cxx11::string_const&,int&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pEVar2->suf_out_,
             (int *)in_RDI);
  this_01 = std::
            map<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::vector<double,_std::allocator<double>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::vector<double,_std::allocator<double>_>_>_>_>
            ::operator[](in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  ~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
         *)0x11dfea);
  __new_size = this_01;
  while( true ) {
    iVar1 = mp::VecReader<std::pair<int,_int>_>::Size(&in_RSI->super_SparseVecReader<int>);
    if (iVar1 == 0) break;
    pVar3 = mp::VecReader<std::pair<int,_int>_>::ReadNext(in_stack_ffffffffffffff68);
    iVar1 = pVar3.first;
    iStack_68 = pVar3.second;
    sVar4 = std::vector<double,_std::allocator<double>_>::size(this_01);
    if (sVar4 <= (ulong)(long)iVar1) {
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)
                 CONCAT44(iVar1,in_stack_ffffffffffffff90),(size_type)__new_size);
    }
    in_stack_ffffffffffffff68 = (VecReader<std::pair<int,_int>_> *)(double)iStack_68;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](this_01,(long)iVar1);
    *pvVar5 = (value_type)in_stack_ffffffffffffff68;
  }
  return;
}

Assistant:

void OnIntSuffix(SuffixReader& sr) {
    const auto& si = sr.SufInfo();
    int kind = si.Kind();
    const std::string& name = si.Name();
    assert(0 == (kind & 4));
    auto& suf_val = Model().suf_out_[std::make_pair(name, kind)];
    while (sr.Size()) {
      std::pair<int, int> val = sr.ReadNext();
      if (suf_val.size() <= val.first)
        suf_val.resize(val.first+1);
      suf_val[val.first] = val.second;
    }
  }